

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::MultiplyPropagateStatistics::Operation<long,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long value;
  int64_t value_00;
  long rvals [2];
  long lvals [2];
  long local_98 [5];
  Value local_70;
  
  value = 0x7fffffffffffffff;
  local_98[2] = NumericStats::GetMin<long>(lstats);
  local_98[3] = NumericStats::GetMax<long>(lstats);
  local_98[0] = NumericStats::GetMin<long>(rstats);
  local_98[1] = NumericStats::GetMax<long>(rstats);
  value_00 = -0x8000000000000000;
  for (uVar1 = 0; uVar1 != 2; uVar1 = uVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      lVar3 = local_98[lVar2] * local_98[uVar1 + 2];
      if ((SEXT816(lVar3) != SEXT816(local_98[lVar2]) * SEXT816(local_98[uVar1 + 2])) ||
         (lVar3 + 0xf21f494c589c0000U < 0xe43e9298b1380001)) goto LAB_007f8057;
      if (lVar3 < value) {
        value = lVar3;
      }
      if (lVar3 - value_00 != 0 && value_00 <= lVar3) {
        value_00 = lVar3;
      }
    }
  }
  Value::Numeric(&local_70,type,value);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,value_00);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
LAB_007f8057:
  return uVar1 < 2;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}